

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O2

bool renderSimilarity(TKeyPressCollection *keyPresses,TSimilarityMap *similarityMap)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer psVar4;
  ulong uVar5;
  bool bVar6;
  ImU32 IVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  uint local_dc;
  ImVec4 local_d8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ulong local_b0;
  ImDrawList *local_a8;
  long local_a0;
  ImVec2 local_98;
  TKeyPressCollection *local_80;
  ulong local_78;
  ulong local_70;
  ImVec2 local_68;
  float local_58;
  undefined4 uStack_50;
  float local_48;
  undefined4 uStack_40;
  
  fVar13 = stateUI.super_stStateUI.windowHeightTitleBar +
           stateUI.super_stStateUI.windowHeightKeyPesses +
           stateUI.super_stStateUI.windowHeightResults;
  local_d8._0_8_ = (ulong)(uint)(float)(int)fVar13 << 0x20;
  local_c0.x = 0.0;
  local_c0.y = 0.0;
  local_80 = keyPresses;
  ImGui::SetNextWindowPos((ImVec2 *)&local_d8,1,&local_c0);
  local_d8.x = (float)g_windowSizeX;
  local_d8.y = (float)(g_windowSizeY - (int)fVar13);
  ImGui::SetNextWindowSize((ImVec2 *)&local_d8,1);
  bVar6 = ImGui::Begin("Similarity",(bool *)0x0,0x804);
  if (bVar6) {
    local_98 = ImGui::GetContentRegionAvail();
    ImGui::PushItemWidth(100.0);
    pvVar2 = (similarityMap->
             super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (similarityMap->
             super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ImGui::SameLine(0.0,-1.0);
    ImGui::SliderFloat("Size",&renderSimilarity::bsize,1.5,24.0,"%.3f",1.0);
    ImGui::SameLine(0.0,-1.0);
    local_d8.x = 0.0;
    local_d8.y = 0.0;
    bVar6 = ImGui::Button("Fit",(ImVec2 *)&local_d8);
    uVar8 = (uint)(((long)pvVar2 - (long)pvVar3) / 0x18);
    if (bVar6) {
      fVar13 = local_98.y;
      if (local_98.x <= local_98.y) {
        fVar13 = local_98.x;
      }
      renderSimilarity::bsize = (fVar13 + -24.0) / (float)(int)uVar8;
    }
    ImGui::SameLine(0.0,-1.0);
    ImGui::SliderFloat("Threshold",&renderSimilarity::threshold,0.0,1.0,"%.3f",1.0);
    ImGui::PopItemWidth();
    local_d8.x = 0.0;
    local_d8.y = 0.0;
    ImGui::BeginChild("Canvas",(ImVec2 *)&local_d8,true,0xc800);
    local_68 = ImGui::GetCursorScreenPos();
    local_a8 = ImGui::GetWindowDrawList();
    if ((int)uVar8 < 1) {
      local_d8.x = 1.0;
      local_d8.y = 0.3;
      local_d8.z = 0.4;
      local_d8.w = 1.0;
      ImGui::TextColored(&local_d8,"Waiting for similarity map to be available!");
    }
    else {
      local_d8.y = (float)(int)uVar8 * renderSimilarity::bsize;
      local_d8.x = (float)(int)uVar8 * renderSimilarity::bsize;
      local_98 = (ImVec2)similarityMap;
      ImGui::InvisibleButton("SimilarityMapIB",(ImVec2 *)&local_d8);
      local_b0 = (ulong)(uVar8 & 0x7fffffff);
      lVar12 = local_b0 << 4;
      local_dc = 0xffffffff;
      local_a0 = 0;
      uVar11 = 0;
      while (uVar11 != local_b0) {
        local_48 = (float)(int)uVar11;
        uStack_40 = 0;
        local_78 = uVar11 + 1;
        local_58 = (float)(int)local_78;
        uStack_50 = 0;
        uVar10 = 0;
        local_70 = uVar11;
        for (lVar9 = 0; lVar12 != lVar9; lVar9 = lVar9 + 0x10) {
          dVar1 = *(double *)(*(long *)(*(long *)local_98 + uVar11 * 0x18) + lVar9);
          local_c0.x = (float)(int)uVar10 * renderSimilarity::bsize + local_68.x;
          local_c0.y = local_48 * renderSimilarity::bsize + local_68.y;
          uVar8 = (int)uVar10 + 1;
          local_b8.x = (float)(int)uVar8 * renderSimilarity::bsize + local_68.x + -1.0;
          local_b8.y = local_58 * renderSimilarity::bsize + local_68.y + -1.0;
          fVar13 = local_b8.x;
          fVar14 = local_b8.y;
          if ((double)renderSimilarity::threshold < dVar1) {
            local_d8.y = (float)dVar1;
            local_d8.x = 1.0 - local_d8.y;
            local_d8._8_8_ = (ulong)(uint)local_d8.y << 0x20;
            IVar7 = ImGui::ColorConvertFloat4ToU32(&local_d8);
            ImDrawList::AddRectFilled(local_a8,&local_c0,&local_b8,IVar7,0.0,0xf);
            fVar13 = local_b8.x;
            fVar14 = local_b8.y;
          }
          local_d8.y = fVar14 + 1.0;
          local_d8.x = fVar13 + 1.0;
          bVar6 = ImGui::IsMouseHoveringRect(&local_c0,(ImVec2 *)&local_d8,true);
          uVar5 = local_70;
          if (bVar6) {
            if (local_a0 == lVar9) {
              local_dc = (uint)local_70;
            }
            bVar6 = ImGui::IsMouseDown(0);
            if (!bVar6) {
              ImGui::BeginTooltip();
              ImGui::Text("[%3d, %3d] = %5.4g\n",
                          *(undefined8 *)(*(long *)(*(long *)local_98 + uVar11 * 0x18) + lVar9),
                          uVar5 & 0xffffffff,uVar10);
              ImGui::EndTooltip();
            }
          }
          uVar10 = (ulong)uVar8;
        }
        local_a0 = local_a0 + 0x10;
        uVar11 = local_78;
      }
      if (-1 < (int)local_dc) {
        uVar11 = 0;
        while (uVar11 != local_b0) {
          psVar4 = (local_80->
                   super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                   super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (psVar4[uVar11].cid == psVar4[local_dc].cid) {
            fVar13 = (float)(int)uVar11 * renderSimilarity::bsize;
            uVar11 = uVar11 + 1;
            local_c0.x = fVar13 + local_68.x;
            local_c0.y = fVar13 + local_68.y;
            fVar13 = (float)(int)uVar11 * renderSimilarity::bsize;
            local_b8.x = fVar13 + local_68.x + -1.0;
            local_b8.y = fVar13 + local_68.y + -1.0;
            local_d8.x = 1.0;
            local_d8.y = 0.0;
            local_d8.z = 0.0;
            local_d8.w = 1.0;
            IVar7 = ImGui::ColorConvertFloat4ToU32(&local_d8);
            ImDrawList::AddRectFilled(local_a8,&local_c0,&local_b8,IVar7,0.0,0xf);
          }
          else {
            uVar11 = uVar11 + 1;
          }
        }
      }
    }
    ImGui::EndChild();
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
  }
  else {
    stateUI.super_stStateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
  }
  ImGui::End();
  return false;
}

Assistant:

bool renderSimilarity(const TKeyPressCollection & keyPresses, const TSimilarityMap & similarityMap) {
    int offsetY = stateUI.windowHeightTitleBar + stateUI.windowHeightKeyPesses + stateUI.windowHeightResults;
    ImGui::SetNextWindowPos(ImVec2(0, offsetY), ImGuiCond_Always);
    ImGui::SetNextWindowSize(ImVec2(1.0f*g_windowSizeX, g_windowSizeY - offsetY), ImGuiCond_Always);
    if (ImGui::Begin("Similarity", nullptr, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_NoMove)) {
        auto wsize = ImGui::GetContentRegionAvail();

        static float bsize = 10.0f;
        static float threshold = 0.0f;
        ImGui::PushItemWidth(100.0);

        int n = similarityMap.size();
        ImGui::SameLine();
        ImGui::SliderFloat("Size", &bsize, 1.5f, 24.0f);
        ImGui::SameLine();
        if (ImGui::Button("Fit")) {
            bsize = (std::min(wsize.x, wsize.y) - 24.0)/n;
        }
        ImGui::SameLine();
        ImGui::SliderFloat("Threshold", &threshold, 0.0f, 1.0f);
        ImGui::PopItemWidth();

        ImGui::BeginChild("Canvas", { 0, 0 }, 1, ImGuiWindowFlags_HorizontalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_AlwaysVerticalScrollbar);
        auto savePos = ImGui::GetCursorScreenPos();
        auto drawList = ImGui::GetWindowDrawList();

        int hoveredId = -1;
        if (n > 0) {
            ImGui::InvisibleButton("SimilarityMapIB", { n*bsize, n*bsize });
            for (int i = 0; i < n; ++i) {
                for (int j = 0; j < n; ++j) {
                    float col = similarityMap[i][j].cc;
                    ImVec2 p0 = {savePos.x + j*bsize, savePos.y + i*bsize};
                    ImVec2 p1 = {savePos.x + (j + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                    if (similarityMap[i][j].cc > threshold) {
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32(ImVec4{1.0f - col, col, 0.0f, col}));
                    }
                    if (ImGui::IsMouseHoveringRect(p0, {p1.x + 1.0f, p1.y + 1.0f})) {
                        if (i == j) hoveredId = i;
                        if (ImGui::IsMouseDown(0) == false) {
                            ImGui::BeginTooltip();
                            //ImGui::Text("[%3d, %3d]\n", keyPresses[i].cid, keyPresses[j].cid);
                            ImGui::Text("[%3d, %3d] = %5.4g\n", i, j, similarityMap[i][j].cc);
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[i][k].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", i, k, (int) similarityMap[i][k].offset);
                            //}
                            //ImGui::Separator();
                            //for (int k = 0; k < n; ++k) {
                            //    if (similarityMap[k][i].cc > 0.5) ImGui::Text("Offset [%3d, %3d] = %d\n", k, i, (int) similarityMap[k][i].offset);
                            //}
                            ImGui::EndTooltip();
                        }
                    }
                }
            }

            if (hoveredId >= 0) {
                for (int i = 0; i < n; ++i) {
                    if (keyPresses[i].cid == keyPresses[hoveredId].cid) {
                        ImVec2 p0 = {savePos.x + i*bsize, savePos.y + i*bsize};
                        ImVec2 p1 = {savePos.x + (i + 1)*bsize - 1.0f, savePos.y + (i + 1)*bsize - 1.0f};
                        drawList->AddRectFilled(p0, p1, ImGui::ColorConvertFloat4ToU32({1.0f, 0.0f, 0.0f, 1.0f}));
                    }
                }
            }
        } else {
            ImGui::TextColored({1.0f, 0.3f, 0.4f, 1.0f}, "Waiting for similarity map to be available!");
        }

        ImGui::EndChild();

        stateUI.windowHeightSimilarity = ImGui::GetWindowHeight();
    } else {
        stateUI.windowHeightSimilarity = ImGui::GetTextLineHeightWithSpacing();
    }
    ImGui::End();
    return false;
}